

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O0

int nn_sipc_recv(nn_pipebase *self,nn_msg *msg)

{
  nn_fsm_event *local_28;
  nn_sipc *sipc;
  nn_msg *msg_local;
  nn_pipebase *self_local;
  
  if (self == (nn_pipebase *)0x0) {
    local_28 = (nn_fsm_event *)0x0;
  }
  else {
    local_28 = &self[-3].in;
  }
  if (((nn_ep_options *)(local_28 + 2))->ipv4only != 4) {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",
            (ulong)(uint)((nn_ep_options *)(local_28 + 2))->ipv4only,"NN_SIPC_STATE_ACTIVE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
            ,0xa3);
    fflush(_stderr);
    nn_err_abort();
  }
  if (*(int *)((long)(local_28 + 0x12) + 0x18) != 3) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sipc->instate == NN_SIPC_INSTATE_HASMSG",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
            ,0xa4);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_msg_mv(msg,(nn_msg *)(local_28 + 0x13));
  nn_msg_init((nn_msg *)(local_28 + 0x13),0);
  *(undefined4 *)((long)(local_28 + 0x12) + 0x18) = 1;
  nn_usock_recv(*(nn_usock **)((long)((nn_ep_options *)(local_28 + 2) + 1) + 4),
                (void *)((long)(local_28 + 0x12) + 0x1c),9,(int *)0x0);
  return 0;
}

Assistant:

static int nn_sipc_recv (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sipc *sipc;

    sipc = nn_cont (self, struct nn_sipc, pipebase);

    nn_assert_state (sipc, NN_SIPC_STATE_ACTIVE);
    nn_assert (sipc->instate == NN_SIPC_INSTATE_HASMSG);

    /*  Move received message to the user. */
    nn_msg_mv (msg, &sipc->inmsg);
    nn_msg_init (&sipc->inmsg, 0);

    /*  Start receiving new message. */
    sipc->instate = NN_SIPC_INSTATE_HDR;
    nn_usock_recv (sipc->usock, sipc->inhdr, sizeof (sipc->inhdr), NULL);

    return 0;
}